

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O0

void __thiscall QFontDialogPrivate::updateSizes(QFontDialogPrivate *this)

{
  bool bVar1;
  byte bVar2;
  QFontDialog *this_00;
  const_iterator o;
  int *piVar3;
  QStringListModel *pQVar4;
  QStyle *pQVar5;
  QFontDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  int current;
  int i;
  QFontDialog *q;
  const_iterator it;
  QStringList str_sizes;
  QList<int> sizes;
  QSignalBlocker blocker;
  QWidget *in_stack_fffffffffffffef8;
  QLineEdit *in_stack_ffffffffffffff00;
  QSignalBlocker *this_01;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  int local_e0;
  int iVar6;
  undefined1 local_c8 [24];
  undefined1 local_b0 [24];
  const_iterator in_stack_ffffffffffffff68;
  undefined1 local_60 [24];
  QList<int> local_48 [2];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(in_RDI);
  QFontListView::currentText
            ((QFontListView *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  bVar1 = QString::isEmpty((QString *)0x79612e);
  bVar2 = bVar1 ^ 0xff;
  QString::~QString((QString *)0x796141);
  if ((bVar2 & 1) == 0) {
    QLineEdit::clear(in_stack_ffffffffffffff00);
  }
  else {
    local_48[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48[0].d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_48[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QFontListView::currentText((QFontListView *)CONCAT17(bVar2,in_stack_ffffffffffffff10));
    QFontListView::currentText((QFontListView *)CONCAT17(bVar2,in_stack_ffffffffffffff10));
    QFontDatabase::pointSizes((QString *)local_48,(QString *)local_60);
    QString::~QString((QString *)0x7961d7);
    QString::~QString((QString *)0x7961e4);
    iVar6 = 0;
    local_e0 = -1;
    QList<QString>::QList((QList<QString> *)0x796228);
    QList<int>::size(local_48);
    QList<QString>::reserve((QList<QString> *)this_00,(qsizetype)in_stack_ffffffffffffff68.i);
    QList<int>::constBegin((QList<int> *)in_stack_ffffffffffffff00);
    while( true ) {
      o = QList<int>::constEnd((QList<int> *)in_stack_ffffffffffffff00);
      bVar1 = QList<int>::const_iterator::operator!=((const_iterator *)&stack0xffffffffffffff68,o);
      if (!bVar1) break;
      piVar3 = QList<int>::const_iterator::operator*((const_iterator *)&stack0xffffffffffffff68);
      QString::number((int)local_b0,*piVar3);
      QList<QString>::append
                ((QList<QString> *)in_stack_ffffffffffffff00,(rvalue_ref)in_stack_fffffffffffffef8);
      QString::~QString((QString *)0x7962bb);
      if ((local_e0 == -1) &&
         (piVar3 = QList<int>::const_iterator::operator*((const_iterator *)&stack0xffffffffffffff68)
         , *piVar3 == in_RDI->size)) {
        local_e0 = iVar6;
      }
      iVar6 = iVar6 + 1;
      QList<int>::const_iterator::operator++((const_iterator *)&stack0xffffffffffffff68);
    }
    pQVar4 = QFontListView::model((QFontListView *)0x79630e);
    QStringListModel::setStringList((QList_conflict2 *)pQVar4);
    if (local_e0 != -1) {
      QFontListView::setCurrentItem((QFontListView *)this_00,iVar6);
    }
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QSignalBlocker::QSignalBlocker
              ((QSignalBlocker *)CONCAT17(bVar2,in_stack_ffffffffffffff10),(QObject *)in_RDI);
    this_01 = (QSignalBlocker *)in_RDI->sizeEdit;
    if ((in_RDI->smoothScalable & 1U) == 0) {
      QFontListView::currentText((QFontListView *)CONCAT17(bVar2,in_stack_ffffffffffffff10));
    }
    else {
      QString::number((int)local_c8,in_RDI->size);
    }
    QLineEdit::setText((QLineEdit *)this_01,(QString *)in_stack_fffffffffffffef8);
    QString::~QString((QString *)0x7963d3);
    pQVar5 = QWidget::style(in_stack_fffffffffffffef8);
    iVar6 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0xd,0,this_00);
    if ((iVar6 != 0) && (bVar1 = QWidget::hasFocus((QWidget *)o.i), bVar1)) {
      QLineEdit::selectAll((QLineEdit *)this_01);
    }
    QSignalBlocker::~QSignalBlocker(this_01);
    QList<QString>::~QList((QList<QString> *)0x79643f);
    QList<int>::~QList((QList<int> *)0x79644c);
  }
  updateSample((QFontDialogPrivate *)CONCAT17(bVar2,in_stack_ffffffffffffff10));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontDialogPrivate::updateSizes()
{
    Q_Q(QFontDialog);

    if (!familyList->currentText().isEmpty()) {
        QList<int> sizes = QFontDatabase::pointSizes(familyList->currentText(), styleList->currentText());

        int i = 0;
        int current = -1;
        QStringList str_sizes;
        str_sizes.reserve(sizes.size());
        for(QList<int>::const_iterator it = sizes.constBegin(); it != sizes.constEnd(); ++it) {
            str_sizes.append(QString::number(*it));
            if (current == -1 && *it == size)
                current = i;
            ++i;
        }
        sizeList->model()->setStringList(str_sizes);
        if (current != -1)
            sizeList->setCurrentItem(current);

        const QSignalBlocker blocker(sizeEdit);
        sizeEdit->setText((smoothScalable ? QString::number(size) : sizeList->currentText()));
        if (q->style()->styleHint(QStyle::SH_FontDialog_SelectAssociatedText, nullptr, q)
                && sizeList->hasFocus())
            sizeEdit->selectAll();
    } else {
        sizeEdit->clear();
    }

    updateSample();
}